

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.h
# Opt level: O2

bool __thiscall minihttp::HttpSocket::HasPendingTask(HttpSocket *this)

{
  size_type sVar1;
  bool bVar2;
  
  bVar2 = true;
  if ((this->_remaining == 0) && ((this->_chunkedTransfer & 1U) == 0)) {
    sVar1 = std::deque<minihttp::Request,_std::allocator<minihttp::Request>_>::size
                      (&(this->_requestQ).c);
    bVar2 = sVar1 != 0;
  }
  return bVar2;
}

Assistant:

bool ExpectMoreData() const { return _remaining || _chunkedTransfer; }